

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dotlockLock(sqlite3_file *id,int eFileLock)

{
  int posixError;
  sqlite3_io_methods *__file;
  int *piVar1;
  int local_34;
  int tErrno;
  int rc;
  char *zLockFile;
  unixFile *pFile;
  int eFileLock_local;
  sqlite3_file *id_local;
  
  __file = id[5].pMethods;
  if (*(char *)((long)&id[3].pMethods + 4) == '\0') {
    id_local._4_4_ = (*aSyscall[0x12].pCurrent)(__file,0x1ff);
    if (id_local._4_4_ < 0) {
      piVar1 = __errno_location();
      posixError = *piVar1;
      if (posixError == 0x11) {
        local_34 = 5;
      }
      else {
        local_34 = sqliteErrorFromPosixError(posixError,0xf0a);
        if (local_34 != 5) {
          storeLastErrno((unixFile *)id,posixError);
        }
      }
      id_local._4_4_ = local_34;
    }
    else {
      *(char *)((long)&id[3].pMethods + 4) = (char)eFileLock;
    }
  }
  else {
    *(char *)((long)&id[3].pMethods + 4) = (char)eFileLock;
    utimes((char *)__file,(timeval *)0x0);
    id_local._4_4_ = 0;
  }
  return id_local._4_4_;
}

Assistant:

static int dotlockLock(sqlite3_file *id, int eFileLock) {
  unixFile *pFile = (unixFile*)id;
  char *zLockFile = (char *)pFile->lockingContext;
  int rc = SQLITE_OK;


  /* If we have any lock, then the lock file already exists.  All we have
  ** to do is adjust our internal record of the lock level.
  */
  if( pFile->eFileLock > NO_LOCK ){
    pFile->eFileLock = eFileLock;
    /* Always update the timestamp on the old file */
#ifdef HAVE_UTIME
    utime(zLockFile, NULL);
#else
    utimes(zLockFile, NULL);
#endif
    return SQLITE_OK;
  }
  
  /* grab an exclusive lock */
  rc = osMkdir(zLockFile, 0777);
  if( rc<0 ){
    /* failed to open/create the lock directory */
    int tErrno = errno;
    if( EEXIST == tErrno ){
      rc = SQLITE_BUSY;
    } else {
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
    }
    return rc;
  } 
  
  /* got it, set the type and return ok */
  pFile->eFileLock = eFileLock;
  return rc;
}